

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# attr.c
# Opt level: O2

attr_list decode_attr_from_xmit(void *buf)

{
  size_t __n;
  char cVar1;
  int iVar2;
  int_attr_struct *__dest;
  undefined8 uVar3;
  attr_p paVar4;
  ushort uVar5;
  ushort uVar6;
  attr_list p_Var7;
  void *__dest_00;
  void **ppvVar8;
  undefined4 uVar9;
  ulong uVar10;
  long lVar11;
  char *buf_00;
  int_attr *buf_01;
  undefined8 *puVar12;
  undefined8 *puVar13;
  
  __n = (ulong)*(byte *)((long)buf + 1) * 8 + 4;
  p_Var7 = internal_create_attr_list((uint)*(byte *)((long)buf + 1),(uint)*(byte *)((long)buf + 2));
  cVar1 = *buf;
  if (words_bigendian == '\0') {
    words_bigendian = '\x01';
  }
  __dest = (p_Var7->l).list.iattrs;
  memcpy(__dest,buf,__n);
  __dest->byte_order = '\0';
  if (cVar1 != '\0') {
    buf_01 = __dest->iattr;
    for (uVar10 = 0; uVar10 < *(byte *)((long)buf + 1); uVar10 = uVar10 + 1) {
      byte_swap((char *)buf_01,4);
      byte_swap((char *)&buf_01->value,4);
      buf_01 = buf_01 + 1;
    }
  }
  lVar11 = 8;
  puVar12 = (undefined8 *)(__n + (long)buf);
  for (uVar10 = 0; uVar10 < *(byte *)((long)buf + 2); uVar10 = uVar10 + 1) {
    uVar3 = *puVar12;
    paVar4 = (p_Var7->l).list.attributes;
    *(undefined8 *)((long)paVar4 + lVar11 + -8) = uVar3;
    if (cVar1 == '\0') {
      uVar9 = (undefined4)((ulong)uVar3 >> 0x20);
    }
    else {
      byte_swap((char *)((long)paVar4 + lVar11 + -8),4);
      buf_00 = (char *)((long)paVar4 + lVar11 + -4);
      byte_swap(buf_00,4);
      uVar9 = *(undefined4 *)buf_00;
    }
    puVar13 = puVar12 + 1;
    switch(uVar9) {
    case 0:
    case 1:
    case 7:
    case 9:
      __assert_fail("0",
                    "/workspace/llm4binary/github/license_c_cmakelists/ornladios[P]ADIOS2/thirdparty/atl/atl/attr.c"
                    ,0x72f,"attr_list decode_attr_from_xmit(void *)");
    case 2:
    case 8:
      *(undefined8 *)((long)&paVar4->attr_id + lVar11) = *puVar13;
      if (cVar1 != '\0') {
        byte_swap((char *)((long)&paVar4->attr_id + lVar11),8);
      }
      puVar13 = puVar12 + 2;
      break;
    case 3:
    case 4:
      uVar6 = *(ushort *)(puVar12 + 1);
      uVar5 = uVar6 >> 8;
      if (cVar1 == '\0') {
        uVar5 = uVar6;
        uVar6 = uVar6 >> 8;
      }
      uVar6 = uVar5 & 0xff | uVar6 << 8;
      ppvVar8 = (void **)((long)&paVar4->attr_id + lVar11);
      iVar2 = *(int *)((long)paVar4 + lVar11 + -4);
      __dest_00 = malloc((long)(short)uVar6);
      memcpy(__dest_00,(void *)((long)puVar12 + 10),(long)(short)uVar6);
      if (iVar2 != 3) {
        *(int *)ppvVar8 = (int)(short)uVar6;
        ppvVar8 = &paVar4[uVar10].value.u.o.buffer;
      }
      *ppvVar8 = __dest_00;
      puVar13 = (undefined8 *)
                ((long)puVar12 + 10 + (long)(int)((int)(short)uVar6 + 5U & 0xfffffffc) + -2);
      break;
    case 5:
      *(undefined4 *)((long)&paVar4->attr_id + lVar11) = *(undefined4 *)puVar13;
      if (cVar1 != '\0') {
        byte_swap((char *)((long)&paVar4->attr_id + lVar11),4);
      }
      puVar13 = (undefined8 *)((long)puVar12 + 0xc);
      break;
    case 6:
      __assert_fail("0",
                    "/workspace/llm4binary/github/license_c_cmakelists/ornladios[P]ADIOS2/thirdparty/atl/atl/attr.c"
                    ,0x756,"attr_list decode_attr_from_xmit(void *)");
    }
    lVar11 = lVar11 + 0x18;
    puVar12 = puVar13;
  }
  return p_Var7;
}

Assistant:

extern attr_list
decode_attr_from_xmit(void * buf)
{
    int_attr_p header = (int_attr_p) buf;
    int iattr_size = sizeof(struct int_attr_struct) + 
	(header->int_attr_count -1) * sizeof(int_attr);
    attr_list l = internal_create_attr_list(header->int_attr_count,
					    header->other_attr_count);
    /* byte swap if the encoders byte order is not equal to ours */
    int bswap = header->byte_order != WORDS_BIGENDIAN;
    char *optr = (char*)buf + iattr_size;
    int i;
    
    memcpy(l->l.list.iattrs, buf, iattr_size);
    l->l.list.iattrs->byte_order = WORDS_BIGENDIAN; /* overwrite original */
    if (bswap) {
	for (i=0; i < header->int_attr_count; i++) {
	    byte_swap((char*)&l->l.list.iattrs->iattr[i].attr_id, 4);
	    byte_swap((char*)&l->l.list.iattrs->iattr[i].value, 4);
	}
    }
    for (i=0; i< header->other_attr_count; i++) {
	memcpy(&l->l.list.attributes[i], optr, 8);
	if (bswap) {
	    byte_swap((char*)&l->l.list.attributes[i].attr_id, 4);
	    byte_swap((char*)&l->l.list.attributes[i].val_type, 4);
	}
	optr += 8;
	switch(l->l.list.attributes[i].val_type) {
	case Attr_Int4:
	case Attr_Undefined:
	case Attr_Float16:
	case Attr_Float4:
	    assert(0);
	    break;
	case Attr_Int8:
	    memcpy(&l->l.list.attributes[i].value, optr, 8);
	    if (bswap) byte_swap((char*)&l->l.list.attributes[i].value, 8);
	    optr += 8;
	    break;
	case Attr_Float8:
	    memcpy(&l->l.list.attributes[i].value, optr, 8);
	    if (bswap) byte_swap((char*)&l->l.list.attributes[i].value, 8);
	    optr += 8;
	    break;
	case Attr_Atom:
	    memcpy(&l->l.list.attributes[i].value, optr, 4);
	    if (bswap) byte_swap((char*)&l->l.list.attributes[i].value, 4);
	    optr += 4;
	    break;
	case Attr_Opaque:
	case Attr_String: {
	    int2 len = *(int2*)optr;
	    int pad_len;
	    if (bswap) byte_swap((char*)&len, 2);
	    pad_len = roundup4(len + 2) - 2;
	    optr += 2;
	    if (l->l.list.attributes[i].val_type == Attr_String) {
		char *value = malloc(len);
		memcpy(value, optr, len);
		l->l.list.attributes[i].value.u.p = value;
	    } else {
		attr_opaque op;
		op.length = len;
		op.buffer = malloc(len);
		memcpy(op.buffer, optr, len);
		l->l.list.attributes[i].value.u.o = op;
	    }
	    optr += pad_len;
	    break;
	  }
	case Attr_List:
	    assert(0);
	    break;
	}
    }
    return l;
}